

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

RangeSelectExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RangeSelectExpression,slang::ast::RangeSelectionKind,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
          (BumpAllocator *this,RangeSelectionKind *args,Type *args_1,Expression *args_2,
          Expression *args_3,Expression *args_4,SourceRange *args_5)

{
  RangeSelectionKind RVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  RangeSelectExpression *pRVar4;
  
  pRVar4 = (RangeSelectExpression *)allocate(this,0x50,8);
  RVar1 = *args;
  SVar2 = args_5->startLoc;
  SVar3 = args_5->endLoc;
  (pRVar4->super_Expression).kind = RangeSelect;
  (pRVar4->super_Expression).type.ptr = args_1;
  (pRVar4->super_Expression).constant = (ConstantValue *)0x0;
  (pRVar4->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pRVar4->super_Expression).sourceRange.startLoc = SVar2;
  (pRVar4->super_Expression).sourceRange.endLoc = SVar3;
  pRVar4->value_ = args_2;
  pRVar4->left_ = args_3;
  pRVar4->right_ = args_4;
  pRVar4->selectionKind = RVar1;
  pRVar4->warnedAboutRange = false;
  return pRVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }